

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_json_file_from_disk.unit.cpp
# Opt level: O0

void __thiscall
TestLoadJSONFromDisk_TestMissingJSONFile_Test::TestBody
          (TestLoadJSONFromDisk_TestMissingJSONFile_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_a30;
  Message local_a28 [2];
  runtime_error *anon_var_0;
  type e;
  string local_9e8;
  ProductData local_9c8;
  byte local_79;
  undefined1 auStack_78 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  undefined1 local_40 [8];
  path clear_3_path;
  ScopedTrace gtest_trace_128;
  TestLoadJSONFromDisk_TestMissingJSONFile_Test *this_local;
  
  testing::ScopedTrace::ScopedTrace
            ((ScopedTrace *)&clear_3_path.field_0x27,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
             ,0x80,"Begin Test: Load missing file from disk.");
  std::filesystem::__cxx11::path::path<char[96],std::filesystem::__cxx11::path>
            ((path *)local_40,
             (char (*) [96])
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test"
             ,auto_format);
  std::filesystem::__cxx11::path::operator/=((path *)local_40,(char (*) [18])0x242ece);
  std::filesystem::__cxx11::path::operator/=
            ((path *)local_40,(char (*) [22])"igsdb_v1_clear_3.json");
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  _auStack_78 = (pointer)0x0;
  gtest_msg.value._M_dataplus._M_p = (pointer)0x0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_78);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_78);
  if (bVar1) {
    local_79 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::filesystem::__cxx11::path::string(&local_9e8,(path *)local_40);
      OpticsParser::parseJSONFile(&local_9c8,&local_9e8);
      OpticsParser::ProductData::~ProductData(&local_9c8);
      std::__cxx11::string::~string((string *)&local_9e8);
    }
    if ((local_79 & 1) != 0) goto LAB_0012a499;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_78,
               "Expected: OpticsParser::parseJSONFile(clear_3_path.string()) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_a28);
  message = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_78);
  testing::internal::AssertHelper::AssertHelper
            (&local_a30,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
             ,0x86,message);
  testing::internal::AssertHelper::operator=(&local_a30,local_a28);
  testing::internal::AssertHelper::~AssertHelper(&local_a30);
  testing::Message::~Message(local_a28);
LAB_0012a499:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_78);
  std::filesystem::__cxx11::path::~path((path *)local_40);
  testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&clear_3_path.field_0x27);
  return;
}

Assistant:

TEST(TestLoadJSONFromDisk, TestMissingJSONFile)
{
    SCOPED_TRACE("Begin Test: Load missing file from disk.");

    std::filesystem::path clear_3_path(TEST_DATA_DIR);
    clear_3_path /= "some_invalid_path";
    clear_3_path /= "igsdb_v1_clear_3.json";

    EXPECT_THROW(OpticsParser::parseJSONFile(clear_3_path.string()), std::runtime_error);
}